

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelfCwiseBinaryOp.h
# Opt level: O2

SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_4>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1,__1,_false>_>
* __thiscall
Eigen::
SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,Eigen::Map<Eigen::Matrix<double,1,-1,1,1,4>,0,Eigen::Stride<0,0>>,Eigen::Block<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,-1,-1,false>,1,-1,false>>
::lazyAssign<Eigen::Block<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>,1,_1,false>>
          (SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,Eigen::Map<Eigen::Matrix<double,1,_1,1,1,4>,0,Eigen::Stride<0,0>>,Eigen::Block<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>,1,_1,false>>
           *this,DenseBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1,__1,_false>_>
                 *rhs)

{
  if (*(long *)(*(long *)this + 0x10) == *(long *)(rhs + 0x10)) {
    internal::
    assign_impl<Eigen::SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_Eigen::Map<Eigen::Matrix<double,_1,_-1,_1,_1,_4>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_-1,_-1,_false>,_1,_-1,_false>_>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_-1,_-1,_false>,_1,_-1,_false>,_1,_0,_0>
    ::run((SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_4>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1,__1,_false>_>
           *)this,(Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1,__1,_false>
                   *)rhs);
    return (SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_4>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1,__1,_false>_>
            *)this;
  }
  __assert_fail("rows() == rhs.rows() && cols() == rhs.cols()",
                "/workspace/llm4binary/github/license_c_cmakelists/jsc723[P]voronoi-remesh/dependencies/eigen/Eigen/src/Core/SelfCwiseBinaryOp.h"
                ,0x88,
                "SelfCwiseBinaryOp<BinOp, Lhs, Rhs> &Eigen::SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, Eigen::Map<Eigen::Matrix<double, 1, -1, 1, 1, 4>>, Eigen::Block<Eigen::Block<Eigen::Matrix<double, 4, 4>>, 1>>::lazyAssign(const DenseBase<RhsDerived> &) [BinOp = Eigen::internal::scalar_sum_op<double>, Lhs = Eigen::Map<Eigen::Matrix<double, 1, -1, 1, 1, 4>>, Rhs = Eigen::Block<Eigen::Block<Eigen::Matrix<double, 4, 4>>, 1>, RhsDerived = Eigen::Block<Eigen::Block<Eigen::Matrix<double, 4, 4>>, 1>]"
               );
}

Assistant:

inline Index cols() const { return m_matrix.cols(); }